

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v7::detail::write_significand<char*,char>
                 (char *out,char *significand,int significand_size,int integral_size,
                 char decimal_point)

{
  char *pcVar1;
  ptrdiff_t _Num;
  size_t __n;
  
  __n = (size_t)integral_size;
  if (integral_size != 0) {
    memmove(out,significand,__n);
  }
  pcVar1 = out + __n;
  if (decimal_point != '\0') {
    *pcVar1 = decimal_point;
    if (significand_size != integral_size) {
      memmove(pcVar1 + 1,significand + __n,(long)significand_size - __n);
    }
    pcVar1 = pcVar1 + 1 + ((long)significand_size - __n);
  }
  return pcVar1;
}

Assistant:

inline OutputIt write_significand(OutputIt out, const char* significand,
                                  int significand_size, int integral_size,
                                  Char decimal_point) {
  out = detail::copy_str<Char>(significand, significand + integral_size, out);
  if (!decimal_point) return out;
  *out++ = decimal_point;
  return detail::copy_str<Char>(significand + integral_size,
                                significand + significand_size, out);
}